

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

string * __thiscall cinatra::uri_t::get_port_abi_cxx11_(uri_t *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *in_RSI;
  string *in_RDI;
  string *port_str;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::string(in_stack_ffffffffffffff60);
  if (((byte)in_RSI[0x70] & 1) == 0) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)(in_RSI + 0x30));
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x30)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RSI);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string(this_00);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
    }
  }
  else {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)(in_RSI + 0x30));
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RSI);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string(in_stack_ffffffffffffff50);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    }
  }
  return in_RDI;
}

Assistant:

std::string get_port() const {
    std::string port_str;
    if (is_ssl) {
      if (port.empty()) {
        port_str = "443";
      }
      else {
        port_str = std::string(port);
      }
    }
    else {
      if (port.empty()) {
        port_str = "80";
      }
      else {
        port_str = std::string(port);
      }
    }

    return port_str;
  }